

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpx_rac.c
# Opt level: O1

int vpx_rac_get(VpxRangeCoder *c)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  
  uVar1 = vpx_rac_renorm(c);
  iVar3 = (c->high * 0x80 + -0x80 >> 8) + 1;
  uVar4 = iVar3 * 0x10000;
  iVar2 = c->high - iVar3;
  bVar5 = uVar4 <= uVar1;
  if (!bVar5) {
    iVar2 = iVar3;
    uVar4 = 0;
  }
  c->high = iVar2;
  c->code_word = uVar1 - uVar4;
  return (int)bVar5;
}

Assistant:

int vpx_rac_get(VpxRangeCoder *c)
{
    return vpx_rac_get_prob(c, 128);
}